

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O3

void __thiscall CodeGenerator::writeReplicators(CodeGenerator *this,ostream *s,Class *clazz)

{
  pointer pRVar1;
  undefined8 *puVar2;
  char cVar3;
  iterator iVar4;
  ostream *poVar5;
  Replicator *r;
  pointer pRVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"    // replicators",0x12);
  cVar3 = (char)s;
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  pRVar6 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar1 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pRVar6 != pRVar1) {
    do {
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
                      *)this,&pRVar6->clazz);
      if ((_Rb_tree_header *)iVar4._M_node == &(this->m_classes)._M_t._M_impl.super__Rb_tree_header)
      {
        __assert_fail("m_classes.find(r.clazz) != m_classes.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/src/renginec/codegenerator.h"
                      ,0x185,"void CodeGenerator::writeReplicators(std::ostream &, Class *)");
      }
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
                      *)this,&pRVar6->clazz);
      puVar2 = *(undefined8 **)(iVar4._M_node + 2);
      std::__ostream_insert<char,std::char_traits<char>>(s,"    struct Replicator_",0x16);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (s,(pRVar6->id)._M_dataplus._M_p,(pRVar6->id)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," : public rengine::Replicator<",0x1e);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)*puVar2,puVar2[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(clazz->name)._M_dataplus._M_p,(clazz->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"> {",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"        rengine::ResourceManager *resourceManager;",0x32);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"        ",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(clazz->name)._M_dataplus._M_p,(clazz->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," *context;",10);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"        ",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)*puVar2,puVar2[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5," *onCreateInstance(unsigned index, unsigned count) {",0x34);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"            ",0xc);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)*puVar2,puVar2[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," *instance = new ",0x11);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)*puVar2,puVar2[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"();",3);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"            instance->initialize(resourceManager);",0x32);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"            ",0xc);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(pRVar6->initializor)._M_dataplus._M_p,
                          (pRVar6->initializor)._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"            context->",0x15);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(pRVar6->parentId)._M_dataplus._M_p,
                          (pRVar6->parentId)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"->append(instance->",0x13);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,*(char **)(puVar2[0x1b] + 0x10),*(long *)(puVar2[0x1b] + 0x18));
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"            return instance;",0x1c)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"        }",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"        void onDestroyInstance(",0x1f);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)*puVar2,puVar2[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," *instance) {",0xd);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"            delete instance;",0x1c)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"        }",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      poVar5 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"    } ",6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(pRVar6->id)._M_dataplus._M_p,(pRVar6->id)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (s,"    void initReplicators(rengine::ResourceManager *manager) {",0x3d);
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  pRVar1 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pRVar6 = (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>.
                _M_impl.super__Vector_impl_data._M_start; pRVar6 != pRVar1; pRVar6 = pRVar6 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(s,"        ",8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (s,(pRVar6->id)._M_dataplus._M_p,(pRVar6->id)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".resourceManager = manager;",0x1b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"        ",8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(pRVar6->id)._M_dataplus._M_p,(pRVar6->id)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".context = this;",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"        ",8);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(pRVar6->id)._M_dataplus._M_p,(pRVar6->id)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".setCount(",10);
    poVar5 = std::ostream::_M_insert<double>((pRVar6->count).numberValue);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"    }",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void CodeGenerator::writeReplicators(std::ostream &s, Class *clazz)
{
    s << "    // replicators" << std::endl;

    // ### this only supports replecating other generated classes..
    for (const Replicator &r : clazz->replicators) {
        assert(m_classes.find(r.clazz) != m_classes.end());
        Class *instanceClass = m_classes.find(r.clazz)->second;
        s << "    struct Replicator_" << r.id << " : public rengine::Replicator<" << instanceClass->name << ", " << clazz->name << "> {" << std::endl
          << "        rengine::ResourceManager *resourceManager;" << std::endl
          << "        " << clazz->name << " *context;" << std::endl
          << "        " << instanceClass->name << " *onCreateInstance(unsigned index, unsigned count) {" << std::endl
          << "            " << instanceClass->name << " *instance = new " << instanceClass->name << "();" << std::endl
          << "            instance->initialize(resourceManager);" << std::endl
          << "            " << r.initializor << std::endl
          << "            context->" << r.parentId << "->append(instance->" << instanceClass->root->id << ");" << std::endl
          << "            return instance;" << std::endl
          << "        }" << std::endl
          << "        void onDestroyInstance(" << instanceClass->name << " *instance) {" << std::endl
          << "            delete instance;" << std::endl
          << "        }" << std::endl
          << "    } " << r.id << ";" << std::endl;
    }

    s << "    void initReplicators(rengine::ResourceManager *manager) {" << std::endl;
    for (const Replicator &r : clazz->replicators) {
        s << "        " << r.id << ".resourceManager = manager;" << std::endl
          << "        " << r.id << ".context = this;" << std::endl
          << "        " << r.id << ".setCount(" << r.count.numberValue << ");" << std::endl;
      }
    s << "    }" << std::endl;

    s << std::endl;
}